

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonFun.cpp
# Opt level: O0

bool setNonBlocking(int fd,bool unBlock)

{
  int iVar1;
  undefined4 local_18;
  int flags;
  bool unBlock_local;
  int fd_local;
  
  local_18 = fcntl(fd,3);
  if (local_18 == 0xffffffff) {
    unBlock_local = false;
  }
  else {
    if (unBlock) {
      local_18 = local_18 | 0x800;
    }
    else {
      local_18 = local_18 & 0xfffff7ff;
    }
    iVar1 = fcntl(fd,4,(ulong)local_18);
    if (iVar1 == -1) {
      unBlock_local = false;
    }
    else {
      unBlock_local = true;
    }
  }
  return unBlock_local;
}

Assistant:

bool setNonBlocking(int fd, bool unBlock)
{
    int flags = fcntl(fd,F_GETFL);
    if (flags == -1)
        return false;

    if (unBlock)
        flags |= O_NONBLOCK;
    else
        flags &= ~O_NONBLOCK;

    if (fcntl(fd,F_SETFL,flags) == -1)
        return false;
    return true;
}